

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O2

void __thiscall Emulator::run(Emulator *this,uint sleep_time)

{
  byte bVar1;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  
  this->running = true;
  bVar1 = 1;
  while ((bVar1 & 1) != 0) {
    update_keys(this);
    run_instruction(this);
    update_timers(this);
    update_screen(this);
    local_20.__r = (ulong)sleep_time;
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_20);
    bVar1 = this->running;
  }
  return;
}

Assistant:

void Emulator::run(uint sleep_time){
	running = true;

	// Main loop. Each cycle we update keys state, run a single instruction,
	// update timers and update the screen.
	while (running){
		update_keys();
		run_instruction();
		update_timers();
		update_screen();
		std::this_thread::sleep_for(std::chrono::microseconds(sleep_time));
	}
}